

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O0

bool llvm::convertWideToUTF8(wstring *Source,string *Result)

{
  UTF32 *pUVar1;
  ConversionResult CVar2;
  long lVar3;
  long lVar4;
  UTF8 *ResultEnd;
  UTF8 *ResultPtr;
  UTF32 *End;
  UTF32 *Start;
  string *Result_local;
  wstring *Source_local;
  
  Start = (UTF32 *)Result;
  Result_local = (string *)Source;
  End = (UTF32 *)std::__cxx11::wstring::data();
  lVar3 = std::__cxx11::wstring::data();
  lVar4 = std::__cxx11::wstring::size();
  pUVar1 = Start;
  ResultPtr = (UTF8 *)(lVar3 + lVar4 * 4);
  std::__cxx11::wstring::size();
  std::__cxx11::string::resize((ulong)pUVar1);
  ResultEnd = (UTF8 *)std::__cxx11::string::operator[]((ulong)Start);
  lVar3 = std::__cxx11::string::operator[]((ulong)Start);
  lVar4 = std::__cxx11::string::size();
  CVar2 = ConvertUTF32toUTF8(&End,(UTF32 *)ResultPtr,&ResultEnd,(UTF8 *)(lVar3 + lVar4),
                             strictConversion);
  pUVar1 = Start;
  if (CVar2 != conversionOK) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::operator[]((ulong)Start);
    std::__cxx11::string::resize((ulong)pUVar1);
  }
  Source_local._7_1_ = CVar2 == conversionOK;
  return Source_local._7_1_;
}

Assistant:

bool convertWideToUTF8(const std::wstring &Source, std::string &Result) {
  if (sizeof(wchar_t) == 1) {
    const UTF8 *Start = reinterpret_cast<const UTF8 *>(Source.data());
    const UTF8 *End =
        reinterpret_cast<const UTF8 *>(Source.data() + Source.size());
    if (!isLegalUTF8String(&Start, End))
      return false;
    Result.resize(Source.size());
    memcpy(&Result[0], Source.data(), Source.size());
    return true;
  } else if (sizeof(wchar_t) == 2) {
    return convertUTF16ToUTF8String(
        llvm::ArrayRef<UTF16>(reinterpret_cast<const UTF16 *>(Source.data()),
                              Source.size()),
        Result);
  } else if (sizeof(wchar_t) == 4) {
    const UTF32 *Start = reinterpret_cast<const UTF32 *>(Source.data());
    const UTF32 *End =
        reinterpret_cast<const UTF32 *>(Source.data() + Source.size());
    Result.resize(UNI_MAX_UTF8_BYTES_PER_CODE_POINT * Source.size());
    UTF8 *ResultPtr = reinterpret_cast<UTF8 *>(&Result[0]);
    UTF8 *ResultEnd = reinterpret_cast<UTF8 *>(&Result[0] + Result.size());
    if (ConvertUTF32toUTF8(&Start, End, &ResultPtr, ResultEnd,
                           strictConversion) == conversionOK) {
      Result.resize(reinterpret_cast<char *>(ResultPtr) - &Result[0]);
      return true;
    } else {
      Result.clear();
      return false;
    }
  } else {
    llvm_unreachable(
        "Control should never reach this point; see static_assert further up");
  }
}